

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O1

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall
anon_unknown.dwarf_39292::ParseDummyTool::createCommand(ParseDummyTool *this,StringRef name)

{
  long lVar1;
  _func_int *p_Var2;
  char cVar3;
  _func_int **pp_Var4;
  long in_RCX;
  size_t sVar5;
  char *pcVar6;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  sVar5 = name.Length;
  pcVar6 = name.Data;
  cVar3 = (**(code **)(**(long **)(pcVar6 + 0x28) + 0x68))();
  if (cVar3 != '\0') {
    local_48 = &local_38;
    if (sVar5 == 0) {
      local_40 = 0;
      local_38 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,sVar5,sVar5 + in_RCX);
    }
    printf("command(\'%s\')\n",local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
    lVar1 = *(long *)(pcVar6 + 8);
    if (lVar1 == 0) {
      local_40 = 0;
      local_38 = 0;
      local_48 = &local_38;
    }
    else {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,lVar1,*(long *)(pcVar6 + 0x10) + lVar1);
    }
    printf("  -- \'tool\': \'%s\')\n",local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  p_Var2 = *(_func_int **)(pcVar6 + 0x28);
  pp_Var4 = (_func_int **)operator_new(0x68);
  *pp_Var4 = (_func_int *)&PTR__Command_00211bb0;
  pp_Var4[1] = (_func_int *)(pp_Var4 + 3);
  if (sVar5 == 0) {
    pp_Var4[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var4 + 3) = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)(pp_Var4 + 1),sVar5,in_RCX + sVar5);
  }
  pp_Var4[9] = (_func_int *)0x0;
  pp_Var4[10] = (_func_int *)0x0;
  pp_Var4[7] = (_func_int *)0x0;
  pp_Var4[8] = (_func_int *)0x0;
  pp_Var4[5] = (_func_int *)0x0;
  pp_Var4[6] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var4 + 0xb) = 0;
  *pp_Var4 = (_func_int *)&PTR__Command_00211210;
  pp_Var4[0xc] = p_Var2;
  (this->super_Tool)._vptr_Tool = pp_Var4;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(
      StringRef name) override {
    if (delegate.shouldShowOutput()) {
      printf("command('%s')\n", name.str().c_str());
      printf("  -- 'tool': '%s')\n", getName().str().c_str());
    }

    return llvm::make_unique<ParseDummyCommand>(delegate, name);
  }